

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O2

void __thiscall MinVR::VRHeadTrackingNode::onVREvent(VRHeadTrackingNode *this,VRDataIndex *e)

{
  __type _Var1;
  VRAnyCoreType t;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  VRMatrix4 local_68;
  
  std::__cxx11::string::string((string *)&local_68,(string *)&e->_indexName);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_68,&this->_trackingEvent);
  std::__cxx11::string::~string((string *)&local_68);
  if (_Var1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Transform",&local_a9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_aa);
    t = VRDataIndex::getValue(e,&local_88,&local_a8,true);
    VRMatrix4::VRMatrix4(&local_68,t);
    VRMatrix4::operator=(&this->_headMatrix,&local_68);
    VRMatrix4::~VRMatrix4(&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void
VRHeadTrackingNode::onVREvent(const VRDataIndex &e)
{
	if (e.getName() == _trackingEvent) {
        _headMatrix = e.getValue("Transform");
    }
}